

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.h
# Opt level: O0

void __thiscall
TTD::FileReader::ReadBytesInto_Fixed<unsigned_long>(FileReader *this,unsigned_long *data)

{
  ulong sizeInBytes;
  ulong count;
  size_t remainingBytes;
  byte *remainingBuff;
  byte *buff;
  size_t sizeAvailable;
  unsigned_long *data_local;
  FileReader *this_local;
  
  sizeInBytes = this->m_buffCount - this->m_cursor;
  if (sizeInBytes < 8) {
    if (sizeInBytes != 0) {
      js_memcpy_s(data,sizeInBytes,this->m_buffer + this->m_cursor,sizeInBytes);
      this->m_cursor = sizeInBytes + this->m_cursor;
    }
    count = 8 - sizeInBytes;
    if (count != 0) {
      ReadBlock(this,this->m_buffer,&this->m_buffCount);
      this->m_cursor = 0;
      if (this->m_buffCount < count) {
        TTDAbort_unrecoverable_error("Not sure what happened");
      }
      js_memcpy_s((void *)((long)data + sizeInBytes),this->m_buffCount,this->m_buffer,count);
      this->m_cursor = count + this->m_cursor;
    }
  }
  else {
    js_memcpy_s(data,sizeInBytes,this->m_buffer + this->m_cursor,8);
    this->m_cursor = this->m_cursor + 8;
  }
  return;
}

Assistant:

void ReadBytesInto_Fixed(T& data)
        {
            size_t sizeAvailable = (this->m_buffCount - this->m_cursor);
            byte* buff = (byte*)&data;

            if(sizeAvailable >= sizeof(T))
            {
                js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeof(T));
                this->m_cursor += sizeof(T);
            }
            else
            {
                if(sizeAvailable > 0)
                {
                    js_memcpy_s(buff, sizeAvailable, this->m_buffer + this->m_cursor, sizeAvailable);
                    this->m_cursor += sizeAvailable;
                }

                byte* remainingBuff = (buff + sizeAvailable);
                size_t remainingBytes = (sizeof(T) - sizeAvailable);

                if(remainingBytes > 0)
                {
                    this->ReadBlock(this->m_buffer, &this->m_buffCount);
                    this->m_cursor = 0;

                    TTDAssert(this->m_buffCount >= remainingBytes, "Not sure what happened");
                    js_memcpy_s(remainingBuff, this->m_buffCount, this->m_buffer, remainingBytes);
                    this->m_cursor += remainingBytes;
                }
            }
        }